

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.h
# Opt level: O2

char * __thiscall
btStaticPlaneShape::serialize(btStaticPlaneShape *this,void *dataBuffer,btSerializer *serializer)

{
  btCollisionShape::serialize((btCollisionShape *)this,dataBuffer,serializer);
  btVector3::serializeFloat(&this->m_localScaling,(btVector3FloatData *)((long)dataBuffer + 0x10));
  btVector3::serializeFloat(&this->m_planeNormal,(btVector3FloatData *)((long)dataBuffer + 0x20));
  *(btScalar *)((long)dataBuffer + 0x30) = this->m_planeConstant;
  return "btStaticPlaneShapeData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btStaticPlaneShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*) dataBuffer;
	btCollisionShape::serialize(&planeData->m_collisionShapeData,serializer);

	m_localScaling.serializeFloat(planeData->m_localScaling);
	m_planeNormal.serializeFloat(planeData->m_planeNormal);
	planeData->m_planeConstant = float(m_planeConstant);
		
	return "btStaticPlaneShapeData";
}